

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O1

void __thiscall tetgenmesh::outhullfaces(tetgenmesh *this,tetgenio *out)

{
  int iVar1;
  long lVar2;
  memorypool *pmVar3;
  void **ppvVar4;
  long lVar5;
  bool bVar6;
  size_t sVar7;
  int *piVar8;
  void *pvVar9;
  undefined4 *puVar10;
  uint uVar11;
  long lVar12;
  uint uVar13;
  int iVar14;
  char facefilename [1024];
  FILE *local_448;
  char local_438 [4];
  undefined2 auStack_434 [514];
  
  if (out == (tetgenio *)0x0) {
    strcpy(local_438,this->b->outfilename);
    sVar7 = strlen(local_438);
    builtin_strncpy(local_438 + sVar7,".fac",4);
    *(undefined2 *)((long)auStack_434 + sVar7) = 0x65;
  }
  if (this->b->quiet == 0) {
    if (out == (tetgenio *)0x0) {
      printf("Writing %s.\n",local_438);
    }
    else {
      puts("Writing faces.");
    }
  }
  if (out == (tetgenio *)0x0) {
    local_448 = fopen(local_438,"w");
    if (local_448 == (FILE *)0x0) {
      printf("File I/O Error:  Cannot create file %s.\n",local_438);
      puVar10 = (undefined4 *)__cxa_allocate_exception(4);
      *puVar10 = 1;
      __cxa_throw(puVar10,&int::typeinfo,0);
    }
    piVar8 = (int *)0x0;
    fprintf(local_448,"%ld  0\n",this->hullsize);
  }
  else {
    lVar2 = this->hullsize;
    local_448 = (FILE *)0x0;
    piVar8 = (int *)operator_new__(-(ulong)((ulong)(lVar2 * 3) >> 0x3e != 0) | lVar2 * 0xc);
    out->trifacelist = piVar8;
    out->numberoftrifaces = (int)lVar2;
  }
  uVar13 = 0;
  if (this->b->zeroindex == 0) {
    uVar13 = this->in->firstnumber;
  }
  pmVar3 = this->tetrahedrons;
  iVar1 = this->in->firstnumber;
  bVar6 = uVar13 == 0;
  ppvVar4 = pmVar3->firstblock;
  pmVar3->pathblock = ppvVar4;
  pmVar3->pathitem =
       (void *)((long)ppvVar4 +
               (((long)pmVar3->alignbytes + 8U) -
               (ulong)(ppvVar4 + 1) % (ulong)(long)pmVar3->alignbytes));
  pmVar3->pathitemsleft = pmVar3->itemsperblock;
  do {
    pvVar9 = memorypool::traverse(this->tetrahedrons);
    if (pvVar9 == (void *)0x0) {
      pvVar9 = (void *)0x0;
      break;
    }
  } while (*(long *)((long)pvVar9 + 0x20) == 0);
  if (pvVar9 != (void *)0x0) {
    iVar14 = 0;
    do {
      uVar11 = (uint)(iVar1 == 1 && bVar6);
      if (*(point *)((long)pvVar9 + 0x38) == this->dummypoint) {
        lVar2 = *(long *)((long)pvVar9 + 0x28);
        lVar5 = *(long *)((long)pvVar9 + 0x30);
        if (out == (tetgenio *)0x0) {
          lVar12 = (long)this->pointmarkindex;
          fprintf(local_448,"%5d   %4d  %4d  %4d",(ulong)uVar13,
                  (ulong)(*(int *)(*(long *)((long)pvVar9 + 0x20) + lVar12 * 4) - uVar11),
                  (ulong)(*(int *)(lVar2 + lVar12 * 4) - uVar11),
                  (ulong)(*(int *)(lVar5 + lVar12 * 4) - uVar11));
          fputc(10,local_448);
        }
        else {
          piVar8[iVar14] =
               *(int *)(*(long *)((long)pvVar9 + 0x20) + (long)this->pointmarkindex * 4) - uVar11;
          piVar8[(long)iVar14 + 1] = *(int *)(lVar2 + (long)this->pointmarkindex * 4) - uVar11;
          piVar8[(long)iVar14 + 2] = *(int *)(lVar5 + (long)this->pointmarkindex * 4) - uVar11;
          iVar14 = iVar14 + 3;
        }
        uVar13 = uVar13 + 1;
      }
      do {
        pvVar9 = memorypool::traverse(this->tetrahedrons);
        if (pvVar9 == (void *)0x0) {
          pvVar9 = (void *)0x0;
          break;
        }
      } while (*(long *)((long)pvVar9 + 0x20) == 0);
    } while (pvVar9 != (void *)0x0);
  }
  if (out == (tetgenio *)0x0) {
    fprintf(local_448,"# Generated by %s\n",this->b->commandline);
    fclose(local_448);
  }
  return;
}

Assistant:

void tetgenmesh::outhullfaces(tetgenio* out)
{
  FILE *outfile = NULL;
  char facefilename[FILENAMESIZE];
  triface hulltet;
  point torg, tdest, tapex;
  int *elist = NULL;
  int firstindex, shift;
  int facenumber;
  int index;

  if (out == (tetgenio *) NULL) {
    strcpy(facefilename, b->outfilename);
    strcat(facefilename, ".face");
  }

  if (!b->quiet) {
    if (out == (tetgenio *) NULL) {
      printf("Writing %s.\n", facefilename);
    } else {
      printf("Writing faces.\n");
    }
  }

  if (out == (tetgenio *) NULL) {
    outfile = fopen(facefilename, "w");
    if (outfile == (FILE *) NULL) {
      printf("File I/O Error:  Cannot create file %s.\n", facefilename);
      terminatetetgen(this, 1);
    }
    fprintf(outfile, "%ld  0\n", hullsize);
  } else {
    // Allocate memory for 'trifacelist'.
    out->trifacelist = new int[hullsize * 3];
    if (out->trifacelist == (int *) NULL) {
      printf("Error:  Out of memory.\n");
      terminatetetgen(this, 1);
    }
    out->numberoftrifaces = hullsize;
    elist = out->trifacelist;
    index = 0;
  }

  // Determine the first index (0 or 1).
  firstindex = b->zeroindex ? 0 : in->firstnumber;
  shift = 0; // Default no shiftment.
  if ((in->firstnumber == 1) && (firstindex == 0)) {
    shift = 1; // Shift the output indices by 1.
  }

  tetrahedrons->traversalinit();
  hulltet.tet = alltetrahedrontraverse();
  facenumber = firstindex;
  while (hulltet.tet != (tetrahedron *) NULL) {
    if (ishulltet(hulltet)) {
      torg = (point) hulltet.tet[4];
      tdest = (point) hulltet.tet[5];
      tapex = (point) hulltet.tet[6];
      if (out == (tetgenio *) NULL) {
        // Face number, indices of three vertices.
        fprintf(outfile, "%5d   %4d  %4d  %4d", facenumber,
                pointmark(torg) - shift, pointmark(tdest) - shift,
                pointmark(tapex) - shift);
        fprintf(outfile, "\n");
      } else {
        // Output indices of three vertices.
        elist[index++] = pointmark(torg) - shift;
        elist[index++] = pointmark(tdest) - shift;
        elist[index++] = pointmark(tapex) - shift;
      }
      facenumber++;
    }
    hulltet.tet = alltetrahedrontraverse();
  }

  if (out == (tetgenio *) NULL) {
    fprintf(outfile, "# Generated by %s\n", b->commandline);
    fclose(outfile);
  }
}